

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ComparePath(string *c1,string *c2)

{
  int iVar1;
  
  if (c1->_M_string_length == c2->_M_string_length) {
    iVar1 = std::char_traits<char>::compare
                      ((c1->_M_dataplus)._M_p,(c2->_M_dataplus)._M_p,c1->_M_string_length);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool SystemTools::ComparePath(const std::string& c1, const std::string& c2)
{
#if defined(_WIN32) || defined(__APPLE__)
# ifdef _MSC_VER
  return _stricmp(c1.c_str(), c2.c_str()) == 0;
# elif defined(__APPLE__) || defined(__GNUC__)
  return strcasecmp(c1.c_str(), c2.c_str()) == 0;
#else
  return SystemTools::Strucmp(c1.c_str(), c2.c_str()) == 0;
# endif
#else
  return c1 == c2;
#endif
}